

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int ellswift_xdh_hash_function_prefix
              (uchar *output,uchar *x32,uchar *ell_a64,uchar *ell_b64,void *data)

{
  secp256k1_sha256 sha;
  size_t in_stack_ffffffffffffff70;
  uchar *in_stack_ffffffffffffff78;
  secp256k1_sha256 *in_stack_ffffffffffffff80;
  
  secp256k1_sha256_initialize((secp256k1_sha256 *)&stack0xffffffffffffff70);
  secp256k1_sha256_write
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  secp256k1_sha256_write
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  secp256k1_sha256_write
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  secp256k1_sha256_write
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  secp256k1_sha256_finalize(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  secp256k1_sha256_clear((secp256k1_sha256 *)0x1092a5);
  return 1;
}

Assistant:

static int ellswift_xdh_hash_function_prefix(unsigned char *output, const unsigned char *x32, const unsigned char *ell_a64, const unsigned char *ell_b64, void *data) {
    secp256k1_sha256 sha;

    secp256k1_sha256_initialize(&sha);
    secp256k1_sha256_write(&sha, data, 64);
    secp256k1_sha256_write(&sha, ell_a64, 64);
    secp256k1_sha256_write(&sha, ell_b64, 64);
    secp256k1_sha256_write(&sha, x32, 32);
    secp256k1_sha256_finalize(&sha, output);
    secp256k1_sha256_clear(&sha);

    return 1;
}